

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS collar(REF_MPI ref_mpi,int argc,char **argv)

{
  char cVar1;
  REF_NODE pRVar2;
  bool bVar3;
  REF_INT RVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  uint uVar9;
  char *pcVar10;
  char *__format;
  long lVar11;
  long lVar12;
  ulong uVar13;
  REF_BOOL RVar14;
  undefined4 *puVar15;
  double dVar16;
  char *pcVar17;
  REF_GRID_conflict ref_grid;
  REF_INT pos;
  REF_DICT faceids;
  char inflate_flat [5];
  REF_DBL rate;
  char inflate_radial [7];
  char inflate_normal [7];
  REF_DBL origin [3];
  REF_GRID_conflict local_f0;
  REF_INT local_e4;
  char *local_e0;
  REF_DICT local_d8;
  double local_d0;
  REF_BOOL local_c8;
  REF_BOOL local_c4;
  undefined4 local_c0;
  uint local_bc;
  char *local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined4 local_90;
  undefined1 local_8c;
  double local_88;
  double local_80;
  undefined4 local_78;
  undefined3 uStack_74;
  undefined4 local_70;
  undefined3 uStack_6c;
  char *local_68;
  char *local_60;
  double local_58;
  double local_48;
  long local_40;
  undefined4 *local_38;
  
  uStack_6c = 0x6c61;
  local_70 = 0x6d726f6e;
  local_8c = 0;
  local_90 = 0x74616c66;
  uStack_74 = 0x6c61;
  local_78 = 0x69646172;
  local_f0 = (REF_GRID)0x0;
  local_e4 = -1;
  uVar5 = ref_args_find(argc,argv,"--debug",&local_e4);
  RVar4 = local_e4;
  if ((uVar5 != 0) && (uVar5 != 5)) {
    pcVar10 = "debug search";
    uVar8 = 0x699;
    goto LAB_00113f1a;
  }
  if (local_e4 == -1) {
    RVar14 = 0;
  }
  else {
    RVar14 = 1;
    if (ref_mpi->id == 0) {
      printf(" --debug %d\n",1);
    }
  }
  if (argc < 8) {
    if (ref_mpi->id == 0) {
      pcVar10 = "not enough required arguments";
LAB_00113eb7:
      puts(pcVar10);
    }
  }
  else {
    local_a8 = (double)CONCAT44(local_a8._4_4_,RVar4);
    pcVar10 = argv[2];
    local_e0 = argv[3];
    local_bc = atoi(argv[4]);
    local_d0 = atof(argv[5]);
    local_b0 = atof(argv[6]);
    dVar16 = atof(argv[7]);
    uVar6 = local_bc;
    cVar1 = *pcVar10;
    if (cVar1 == 'f') {
      puVar15 = &local_90;
      local_c8 = 1;
      local_c0 = 0;
    }
    else if (cVar1 == 'n') {
      local_c8 = 0;
      puVar15 = &local_70;
      local_c0 = 1;
    }
    else {
      if (cVar1 != 'r') {
        if (ref_mpi->id == 0) {
          printf("unable to parse inflate method >%s<\n",pcVar10);
        }
        goto LAB_00113ed6;
      }
      puVar15 = &local_78;
      local_c8 = 0;
      local_c0 = 0;
    }
    local_c4 = RVar14;
    if (ref_mpi->id == 0) {
      local_98 = dVar16;
      printf("inflation method %s\n",puVar15);
      printf("number of layers %d\n",(ulong)uVar6);
      printf("first thickness %f\n",local_d0);
      printf("total thickness %f\n",local_b0);
      printf("mach %f\n",local_98);
      dVar16 = local_98;
    }
    if (((((int)uVar6 < 1) || (local_d0 <= 0.0)) || (local_b0 <= 0.0)) || (dVar16 <= 1.0)) {
      if (ref_mpi->id == 0) {
        pcVar10 = "number of layers and thicknesses must be positive and Mach supersonic";
        goto LAB_00113eb7;
      }
    }
    else {
      local_98 = dVar16;
      local_38 = puVar15;
      local_a0 = asin(1.0 / dVar16);
      uVar6 = ref_inflate_rate(uVar6,local_d0,local_b0,&local_80);
      if (uVar6 != 0) {
        pcVar10 = "compute rate";
        uVar8 = 0x6d1;
        goto LAB_00113f9e;
      }
      if (ref_mpi->id == 0) {
        printf("layer growth rate %f\n",local_80);
        printf("mach angle %f rad %f deg\n",local_a0,(local_a0 * 180.0) / 3.14159265358979);
      }
      uVar6 = ref_dict_create(&local_d8);
      if (uVar6 != 0) {
        pcVar10 = "create";
        uVar8 = 0x6d9;
        goto LAB_00113f9e;
      }
      uVar6 = ref_args_find(argc,argv,"--fun3d-mapbc",&local_e4);
      if ((uVar6 != 0) && (uVar6 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x6dc,"collar",(ulong)uVar6,"arg search");
        uVar5 = uVar6;
      }
      if ((uVar6 != 5) && (uVar6 != 0)) {
        return uVar5;
      }
      if ((long)local_e4 != -1) {
        if (argc + -1 <= local_e4) {
          if (ref_mpi->id == 0) {
            pcVar10 = "--fun3d-mapbc requires a filename";
            goto LAB_00113eb7;
          }
          goto LAB_00113ed6;
        }
        if (ref_mpi->id == 0) {
          pcVar10 = argv[(long)local_e4 + 1];
          printf("reading fun3d bc map %s\n",pcVar10);
          uVar6 = ref_phys_read_mapbc_token(local_d8,pcVar10,"inflate");
          if (uVar6 != 0) {
            pcVar10 = "unable to read fun3d formatted mapbc";
            uVar8 = 0x6e9;
            goto LAB_00113f9e;
          }
        }
      }
      uVar6 = ref_args_find(argc,argv,"--usm3d-mapbc",&local_e4);
      if ((uVar6 != 0) && (uVar6 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x6ee,"collar",(ulong)uVar6,"arg search");
        uVar5 = uVar6;
      }
      if ((uVar6 != 5) && (uVar6 != 0)) {
        return uVar5;
      }
      lVar11 = (long)local_e4;
      if (lVar11 != -1) {
        if (argc + -3 <= local_e4) {
          if (ref_mpi->id == 0) {
            pcVar10 = "--usm3d-mapbc requires a filename, family, and bc type";
            goto LAB_00113eb7;
          }
          goto LAB_00113ed6;
        }
        if (ref_mpi->id == 0) {
          uVar6 = atoi(argv[lVar11 + 3]);
          pcVar10 = argv[lVar11 + 1];
          local_b8 = argv[lVar11 + 2];
          printf("reading usm3d bc map %s family %s bc %d\n",pcVar10,local_b8,(ulong)uVar6);
          uVar6 = ref_inflate_read_usm3d_mapbc(local_d8,pcVar10,local_b8,uVar6);
          if (uVar6 != 0) {
            pcVar10 = "faceids from mapbc";
            uVar8 = 0x700;
            goto LAB_00113f9e;
          }
        }
      }
      uVar6 = ref_dict_bcast(local_d8,ref_mpi);
      if (uVar6 != 0) {
        pcVar10 = "bcast";
        uVar8 = 0x704;
        goto LAB_00113f9e;
      }
      if (ref_mpi->id == 0) {
        printf("inflating %d faces\n",(ulong)(uint)local_d8->n);
      }
      if (0 < local_d8->n) {
        ref_mpi_stopwatch_start(ref_mpi);
        if (ref_mpi->n < 2) {
          if (ref_mpi->id == 0) {
            printf("import %s\n",local_e0);
          }
          uVar6 = ref_import_by_extension(&local_f0,ref_mpi,local_e0);
          if (uVar6 != 0) {
            pcVar10 = "import";
            uVar8 = 0x71b;
            goto LAB_00113f9e;
          }
          pcVar10 = "core import";
        }
        else {
          if (ref_mpi->id == 0) {
            printf("part %s\n",local_e0);
          }
          uVar6 = ref_part_by_extension(&local_f0,ref_mpi,local_e0);
          if (uVar6 != 0) {
            pcVar10 = "part";
            uVar8 = 0x713;
LAB_00113f9e:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,uVar8,"collar",(ulong)uVar6,pcVar10);
            return uVar6;
          }
          ref_mpi_stopwatch_stop(ref_mpi,"core part");
          uVar6 = ref_migrate_to_balance(local_f0);
          if (uVar6 != 0) {
            pcVar10 = "balance";
            uVar8 = 0x715;
            goto LAB_00113f9e;
          }
          ref_mpi_stopwatch_stop(ref_mpi,"balance core");
          uVar6 = ref_grid_pack(local_f0);
          if (uVar6 != 0) {
            pcVar10 = "pack";
            uVar8 = 0x717;
            goto LAB_00113f9e;
          }
          pcVar10 = "pack core";
        }
        ref_mpi_stopwatch_stop(ref_mpi,pcVar10);
        if (ref_mpi->id == 0) {
          printf("  read %ld vertices\n",local_f0->node->old_n_global);
        }
        uVar6 = ref_args_find(argc,argv,"--rotate",&local_e4);
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x723,"collar",(ulong)uVar6,"rotate search");
          uVar5 = uVar6;
        }
        if ((uVar6 != 5) && (uVar6 != 0)) {
          return uVar5;
        }
        if ((long)local_e4 != -1) {
          if (argc + -1 <= local_e4) {
            pcVar10 = "--rotate requires a value";
            uVar8 = 0x729;
            goto LAB_001146d9;
          }
          pRVar2 = local_f0->node;
          dVar16 = atof(argv[(long)local_e4 + 1]);
          local_e0 = (char *)((dVar16 / 180.0) * 3.14159265358979);
          if (ref_mpi->id == 0) {
            printf(" --rotate %f deg (%f rad)\n",dVar16,local_e0);
          }
          iVar7 = pRVar2->max;
          if (0 < iVar7) {
            lVar12 = 0;
            lVar11 = 0;
            do {
              if (-1 < pRVar2->global[lVar11]) {
                local_b8 = *(char **)((long)pRVar2->real + lVar12);
                local_48 = *(double *)((long)pRVar2->real + lVar12 + 0x10);
                local_40 = lVar11;
                local_88 = cos((double)local_e0);
                dVar16 = sin((double)local_e0);
                *(double *)((long)pRVar2->real + lVar12) =
                     local_88 * (double)local_b8 - dVar16 * local_48;
                local_88 = sin((double)local_e0);
                dVar16 = cos((double)local_e0);
                *(double *)((long)pRVar2->real + lVar12 + 0x10) =
                     local_88 * (double)local_b8 + dVar16 * local_48;
                iVar7 = pRVar2->max;
                lVar11 = local_40;
              }
              lVar11 = lVar11 + 1;
              lVar12 = lVar12 + 0x78;
            } while (lVar11 < iVar7);
          }
        }
        uVar6 = ref_args_find(argc,argv,"--origin",&local_e4);
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x73a,"collar",(ulong)uVar6,"origin search");
          uVar5 = uVar6;
        }
        if ((uVar6 != 5) && (uVar6 != 0)) {
          return uVar5;
        }
        lVar11 = (long)local_e4;
        if (lVar11 == -1) {
          uVar5 = ref_inflate_origin(local_f0,local_d8,(REF_DBL *)&local_68);
          if (uVar5 != 0) {
            pcVar10 = "orig";
            uVar8 = 0x744;
            goto LAB_00113f1a;
          }
          if (ref_mpi->id == 0) {
            __format = " --origin %f %f %f inferred from z-midpoint\n";
            pcVar10 = local_68;
            pcVar17 = local_60;
            goto LAB_00114722;
          }
        }
        else {
          if (argc + -3 <= local_e4) {
            pcVar10 = "--origin requires three values";
            uVar8 = 0x73c;
LAB_001146d9:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,uVar8,"collar",pcVar10);
            return 1;
          }
          local_e0 = (char *)atof(argv[lVar11 + 1]);
          local_68 = local_e0;
          local_b8 = (char *)atof(argv[lVar11 + 2]);
          local_60 = local_b8;
          local_58 = atof(argv[lVar11 + 3]);
          if (ref_mpi->id == 0) {
            __format = " --origin %f %f %f from argument\n";
            pcVar10 = local_e0;
            pcVar17 = local_b8;
LAB_00114722:
            printf(__format,pcVar10,pcVar17);
          }
        }
        if (local_a8._0_4_ != -1) {
          uVar5 = ref_gather_tec_movie_record_button(local_f0->gather,1);
          if (uVar5 != 0) {
            pcVar10 = "movie on";
            uVar8 = 0x74c;
            goto LAB_00113f1a;
          }
          uVar5 = ref_gather_tec_movie_frame(local_f0,"core");
          if (uVar5 != 0) {
            pcVar10 = "movie frame";
            uVar8 = 0x74d;
            goto LAB_00113f1a;
          }
        }
        uVar6 = local_bc;
        local_a8 = 0.0;
        uVar9 = 0;
        do {
          dVar16 = pow(local_80,(double)(int)uVar9);
          local_e0 = (char *)(dVar16 * local_d0);
          dVar16 = tan(local_a0);
          if ((char)local_c0 == '\0') {
            uVar5 = ref_inflate_radially
                              (local_f0,local_d8,(REF_DBL *)&local_68,(REF_DBL)local_e0,local_a0,0.0
                               ,local_c8,local_c4);
            if (uVar5 != 0) {
              pcVar10 = "inflate";
              uVar8 = 0x759;
              goto LAB_00113f1a;
            }
          }
          else {
            uVar5 = ref_inflate_face(local_f0,local_d8,(REF_DBL *)&local_68,(REF_DBL)local_e0,
                                     (double)local_e0 / dVar16);
            if (uVar5 != 0) {
              pcVar10 = "inflate";
              uVar8 = 0x75c;
              goto LAB_00113f1a;
            }
          }
          local_a8 = local_a8 + (double)local_e0;
          uVar9 = uVar9 + 1;
          if (ref_mpi->id == 0) {
            printf("layer%5d of%5d thickness %10.3e total %10.3e %ld nodes\n",local_e0,local_a8,
                   (ulong)uVar9,(ulong)uVar6,local_f0->node->old_n_global);
          }
        } while (uVar6 != uVar9);
        ref_mpi_stopwatch_stop(local_f0->mpi,"inflate");
        if (ref_mpi->id == 0) {
          printf("inflated %d faces\n",(ulong)(uint)local_d8->n);
          printf("mach %f mach angle %f rad %f deg\n",local_98,local_a0,
                 (local_a0 * 180.0) / 3.14159265358979);
          printf("first thickness %f\n",local_d0);
          printf("total thickness %f\n",local_b0);
          printf("rate %f\n",local_80);
          printf("layers %d\n",(ulong)local_bc);
          printf("inflate method %s\n",local_38);
        }
        bVar3 = true;
        uVar13 = 0;
        do {
          pcVar10 = argv[uVar13];
          if (((*pcVar10 == '-') && (pcVar10[1] == 'x')) && (pcVar10[2] == '\0')) {
            if (ref_mpi->n < 2) {
              if (ref_mpi->id == 0) {
                printf("export %ld nodes to %s\n",local_f0->node->old_n_global,argv[uVar13 + 1]);
              }
              uVar5 = ref_export_by_extension(local_f0,argv[uVar13 + 1]);
              pcVar10 = "export";
              if (uVar5 != 0) {
                pcVar10 = "export -x";
                uVar8 = 0x781;
                goto LAB_00113f1a;
              }
            }
            else {
              if (ref_mpi->id == 0) {
                printf("gather %ld nodes to %s\n",local_f0->node->old_n_global,argv[uVar13 + 1]);
              }
              uVar5 = ref_gather_by_extension(local_f0,argv[uVar13 + 1]);
              pcVar10 = "gather";
              if (uVar5 != 0) {
                pcVar10 = "gather -x";
                uVar8 = 0x77b;
                goto LAB_00113f1a;
              }
            }
            ref_mpi_stopwatch_stop(local_f0->mpi,pcVar10);
            bVar3 = false;
          }
          uVar13 = uVar13 + 1;
        } while (argc - 1 != uVar13);
        if (bVar3) {
          if (ref_mpi->id == 0) {
            printf("gather %ld nodes to %s\n",local_f0->node->old_n_global,"inflated.b8.ugrid");
          }
          uVar5 = ref_gather_by_extension(local_f0,"inflated.b8.ugrid");
          if (uVar5 != 0) {
            pcVar10 = "gather";
            uVar8 = 0x78b;
            goto LAB_00113f1a;
          }
          ref_mpi_stopwatch_stop(local_f0->mpi,"gather");
        }
        uVar5 = ref_dict_free(local_d8);
        if (uVar5 == 0) {
          uVar5 = ref_grid_free(local_f0);
          if (uVar5 == 0) {
            return 0;
          }
          pcVar10 = "grid";
          uVar8 = 0x790;
        }
        else {
          pcVar10 = "free";
          uVar8 = 0x78f;
        }
        goto LAB_00113f1a;
      }
      if (ref_mpi->id == 0) {
        pcVar10 = "no faces to inflate, use --fun3d-mapbc or --usm3d-mapbc";
        goto LAB_00113eb7;
      }
    }
  }
LAB_00113ed6:
  if (ref_mpi->id == 0) {
    collar_help(*argv);
  }
  uVar5 = ref_grid_free(local_f0);
  if (uVar5 == 0) {
    return 1;
  }
  pcVar10 = "grid";
  uVar8 = 0x795;
LAB_00113f1a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar8,"collar",(ulong)uVar5,pcVar10);
  return uVar5;
}

Assistant:

static REF_STATUS collar(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *input_filename = NULL;
  char *inflate_arg = NULL;
  char inflate_normal[] = "normal";
  char inflate_flat[] = "flat";
  char inflate_radial[] = "radial";
  char *inflate_method = NULL;
  REF_GRID ref_grid = NULL;
  REF_INT nlayers, layer;
  REF_DBL first_thickness, total_thickness, mach, mach_angle_rad;
  REF_DBL alpha_rad = 0.0;
  REF_DBL thickness, total, xshift;
  REF_DBL rate;
  REF_DICT faceids;
  REF_INT pos, opt;
  REF_DBL origin[3];
  REF_BOOL debug = REF_FALSE;
  REF_BOOL extrude_radially = REF_FALSE;
  REF_BOOL on_rails = REF_FALSE;
  REF_BOOL default_export_filename = REF_TRUE;

  pos = REF_EMPTY;
  RXS(ref_args_find(argc, argv, "--debug", &pos), REF_NOT_FOUND,
      "debug search");
  if (REF_EMPTY != pos) {
    debug = REF_TRUE;
    if (ref_mpi_once(ref_mpi)) printf(" --debug %d\n", (int)debug);
  }

  if (argc < 8) {
    if (ref_mpi_once(ref_mpi)) {
      printf("not enough required arguments\n");
    }
    goto shutdown;
  }
  inflate_arg = argv[2];
  input_filename = argv[3];
  nlayers = atoi(argv[4]);
  first_thickness = atof(argv[5]);
  total_thickness = atof(argv[6]);
  mach = atof(argv[7]);

  inflate_method = NULL;
  if (strncmp(inflate_arg, "n", 1) == 0) {
    inflate_method = inflate_normal;
  } else if (strncmp(inflate_arg, "f", 1) == 0) {
    inflate_method = inflate_flat;
    extrude_radially = REF_TRUE;
    on_rails = REF_TRUE;
  } else if (strncmp(inflate_arg, "r", 1) == 0) {
    inflate_method = inflate_radial;
    extrude_radially = REF_TRUE;
  }
  if (NULL == inflate_method) {
    if (ref_mpi_once(ref_mpi)) {
      printf("unable to parse inflate method >%s<\n", inflate_arg);
    }
    goto shutdown;
  }

  if (ref_mpi_once(ref_mpi)) {
    printf("inflation method %s\n", inflate_method);
    printf("number of layers %d\n", nlayers);
    printf("first thickness %f\n", first_thickness);
    printf("total thickness %f\n", total_thickness);
    printf("mach %f\n", mach);
  }

  if (nlayers <= 0 || first_thickness <= 0.0 || total_thickness <= 0.0 ||
      mach <= 1.0) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "number of layers and thicknesses must be positive and "
          "Mach supersonic\n");
    }
    goto shutdown;
  }
  mach_angle_rad = asin(1 / mach);
  RSS(ref_inflate_rate(nlayers, first_thickness, total_thickness, &rate),
      "compute rate");

  if (ref_mpi_once(ref_mpi)) {
    printf("layer growth rate %f\n", rate);
    printf("mach angle %f rad %f deg\n", mach_angle_rad,
           ref_math_in_degrees(mach_angle_rad));
  }

  RSS(ref_dict_create(&faceids), "create");

  RXS(ref_args_find(argc, argv, "--fun3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    const char *mapbc;
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi)) {
        printf("--fun3d-mapbc requires a filename\n");
      }
      goto shutdown;
    }
    mapbc = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) {
      printf("reading fun3d bc map %s\n", mapbc);
      RSS(ref_phys_read_mapbc_token(faceids, mapbc, "inflate"),
          "unable to read fun3d formatted mapbc");
    }
  }

  RXS(ref_args_find(argc, argv, "--usm3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    const char *mapbc;
    const char *family_name;
    REF_INT bc_type;
    if (pos >= argc - 3) {
      if (ref_mpi_once(ref_mpi)) {
        printf("--usm3d-mapbc requires a filename, family, and bc type\n");
      }
      goto shutdown;
    }
    mapbc = argv[pos + 1];
    family_name = argv[pos + 2];
    bc_type = atoi(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi)) {
      printf("reading usm3d bc map %s family %s bc %d\n", mapbc, family_name,
             bc_type);
      RSS(ref_inflate_read_usm3d_mapbc(faceids, mapbc, family_name, bc_type),
          "faceids from mapbc");
    }
  }

  RSS(ref_dict_bcast(faceids, ref_mpi), "bcast");
  if (ref_mpi_once(ref_mpi)) {
    printf("inflating %d faces\n", ref_dict_n(faceids));
  }
  if (ref_dict_n(faceids) <= 0) {
    if (ref_mpi_once(ref_mpi)) {
      printf("no faces to inflate, use --fun3d-mapbc or --usm3d-mapbc\n");
    }
    goto shutdown;
  }

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", input_filename);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, input_filename), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "core part");
    RSS(ref_migrate_to_balance(ref_grid), "balance");
    ref_mpi_stopwatch_stop(ref_mpi, "balance core");
    RSS(ref_grid_pack(ref_grid), "pack");
    ref_mpi_stopwatch_stop(ref_mpi, "pack core");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", input_filename);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, input_filename), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "core import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  RXS(ref_args_find(argc, argv, "--rotate", &pos), REF_NOT_FOUND,
      "rotate search");
  if (REF_EMPTY != pos) {
    REF_DBL rotate_deg, rotate_rad;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    REF_DBL x, z;
    if (pos >= argc - 1) THROW("--rotate requires a value");
    rotate_deg = atof(argv[pos + 1]);
    rotate_rad = ref_math_in_radians(rotate_deg);
    if (ref_mpi_once(ref_mpi))
      printf(" --rotate %f deg (%f rad)\n", rotate_deg, rotate_rad);

    each_ref_node_valid_node(ref_node, node) {
      x = ref_node_xyz(ref_node, 0, node);
      z = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 0, node) =
          x * cos(rotate_rad) - z * sin(rotate_rad);
      ref_node_xyz(ref_node, 2, node) =
          x * sin(rotate_rad) + z * cos(rotate_rad);
    }
  }

  RXS(ref_args_find(argc, argv, "--origin", &pos), REF_NOT_FOUND,
      "origin search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 3) THROW("--origin requires three values");
    origin[0] = atof(argv[pos + 1]);
    origin[1] = atof(argv[pos + 2]);
    origin[2] = atof(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi))
      printf(" --origin %f %f %f from argument\n", origin[0], origin[1],
             origin[2]);
  } else {
    RSS(ref_inflate_origin(ref_grid, faceids, origin), "orig");
    if (ref_mpi_once(ref_mpi))
      printf(" --origin %f %f %f inferred from z-midpoint\n", origin[0],
             origin[1], origin[2]);
  }

  if (debug) {
    RSS(ref_gather_tec_movie_record_button(ref_grid_gather(ref_grid), REF_TRUE),
        "movie on");
    ref_gather_blocking_frame(ref_grid, "core");
  }

  total = 0.0;
  for (layer = 0; layer < nlayers; layer++) {
    thickness = first_thickness * pow(rate, layer);
    total = total + thickness;
    xshift = thickness / tan(mach_angle_rad);

    if (extrude_radially) {
      RSS(ref_inflate_radially(ref_grid, faceids, origin, thickness,
                               mach_angle_rad, alpha_rad, on_rails, debug),
          "inflate");
    } else {
      RSS(ref_inflate_face(ref_grid, faceids, origin, thickness, xshift),
          "inflate");
    }

    if (ref_mpi_once(ref_mpi))
      printf("layer%5d of%5d thickness %10.3e total %10.3e " REF_GLOB_FMT
             " nodes\n",
             layer + 1, nlayers, thickness, total,
             ref_node_n_global(ref_grid_node(ref_grid)));
  }

  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "inflate");

  if (ref_mpi_once(ref_mpi)) {
    printf("inflated %d faces\n", ref_dict_n(faceids));
    printf("mach %f mach angle %f rad %f deg\n", mach, mach_angle_rad,
           ref_math_in_degrees(mach_angle_rad));
    printf("first thickness %f\n", first_thickness);
    printf("total thickness %f\n", total_thickness);
    printf("rate %f\n", rate);
    printf("layers %d\n", nlayers);
    printf("inflate method %s\n", inflate_method);
  }

  /* export via -x grid.ext and -f final-surf.tec and -q final-vol.plt */
  for (opt = 0; opt < argc - 1; opt++) {
    if (strcmp(argv[opt], "-x") == 0) {
      default_export_filename = REF_FALSE;
      if (ref_mpi_para(ref_mpi)) {
        if (ref_mpi_once(ref_mpi))
          printf("gather " REF_GLOB_FMT " nodes to %s\n",
                 ref_node_n_global(ref_grid_node(ref_grid)), argv[opt + 1]);
        RSS(ref_gather_by_extension(ref_grid, argv[opt + 1]), "gather -x");
        ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "gather");
      } else {
        if (ref_mpi_once(ref_mpi))
          printf("export " REF_GLOB_FMT " nodes to %s\n",
                 ref_node_n_global(ref_grid_node(ref_grid)), argv[opt + 1]);
        RSS(ref_export_by_extension(ref_grid, argv[opt + 1]), "export -x");
        ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "export");
      }
    }
  }

  if (default_export_filename) {
    if (ref_mpi_once(ref_mpi))
      printf("gather " REF_GLOB_FMT " nodes to %s\n",
             ref_node_n_global(ref_grid_node(ref_grid)), "inflated.b8.ugrid");
    RSS(ref_gather_by_extension(ref_grid, "inflated.b8.ugrid"), "gather");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "gather");
  }

  RSS(ref_dict_free(faceids), "free");
  RSS(ref_grid_free(ref_grid), "grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) collar_help(argv[0]);
  RSS(ref_grid_free(ref_grid), "grid");
  return REF_FAILURE;
}